

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

void __thiscall Fluid::setup_grid_project(Fluid *this,float dt)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  GLint GVar4;
  allocator<char> local_ad;
  float local_ac;
  GLchar *local_a8 [4];
  GLchar *local_88 [4];
  GLchar *local_68 [4];
  GLchar *local_48 [4];
  
  local_ac = dt;
  (*glad_glMemoryBarrier)(0xffffffff);
  gfx::Program::use(&this->setup_grid_project_program);
  p_Var1 = glad_glUniform1f;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"dt",&local_ad);
  GVar4 = (*glad_glGetUniformLocation)((this->setup_grid_project_program).id,local_48[0]);
  (*p_Var1)(GVar4,local_ac);
  std::__cxx11::string::~string((string *)local_48);
  p_Var2 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"bounds_min",&local_ad);
  GVar4 = (*glad_glGetUniformLocation)((this->setup_grid_project_program).id,local_68[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_min);
  std::__cxx11::string::~string((string *)local_68);
  p_Var2 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"bounds_max",&local_ad);
  GVar4 = (*glad_glGetUniformLocation)((this->setup_grid_project_program).id,local_88[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_max);
  std::__cxx11::string::~string((string *)local_88);
  p_Var3 = glad_glUniform3iv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"grid_dim",&local_ad);
  GVar4 = (*glad_glGetUniformLocation)((this->setup_grid_project_program).id,local_a8[0]);
  (*p_Var3)(GVar4,1,(GLint *)&this->grid_dimensions);
  std::__cxx11::string::~string((string *)local_a8);
  gfx::Program::validate(&this->setup_grid_project_program);
  (*glad_glDispatchCompute)
            ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
             (this->grid_dimensions).field_2.z);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void setup_grid_project(float dt) {
        ssbo_barrier();
        setup_grid_project_program.use();
        glUniform1f(setup_grid_project_program.uniform_loc("dt"), dt);
        glUniform3fv(setup_grid_project_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(setup_grid_project_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(setup_grid_project_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        setup_grid_project_program.validate();
        glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        setup_grid_project_program.disuse();
    }